

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGPlanner.cpp
# Opt level: O2

void __thiscall
PerseusBGPlanner::PerseusBGPlanner
          (PerseusBGPlanner *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu)

{
  undefined1 *this_00;
  undefined1 *this_01;
  
  this_01 = &(this->super_AlphaVectorBG).field_0xe8;
  AlphaVectorPlanning::AlphaVectorPlanning((AlphaVectorPlanning *)this_01,pu);
  AlphaVectorBG::AlphaVectorBG(&this->super_AlphaVectorBG,&PTR_construction_vtable_24__005e13b8,pu);
  this_00 = &(this->super_AlphaVectorBG).field_0x18;
  PerseusQFunctionPlanner::PerseusQFunctionPlanner
            ((PerseusQFunctionPlanner *)this_00,&PTR_construction_vtable_24__005e13c8,pu);
  (this->super_AlphaVectorBG)._vptr_AlphaVectorBG = (_func_int **)0x5e12d8;
  *(undefined8 *)&(this->super_AlphaVectorBG).field_0xe8 = 0x5e13a0;
  *(undefined8 *)&(this->super_AlphaVectorBG).field_0x18 = 0x5e1310;
  *(undefined4 *)&(this->super_AlphaVectorBG).field_0xe0 = 2;
  AlphaVectorPlanning::Initialize((AlphaVectorPlanning *)this_01);
  Perseus::Initialize((Perseus *)this_00);
  return;
}

Assistant:

PerseusBGPlanner::PerseusBGPlanner(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu) :
    AlphaVectorPlanning(pu),
    AlphaVectorBG(pu),
    PerseusQFunctionPlanner(pu),
    _m_backupType(BGIP_SOLVER_EXHAUSTIVE)
{
    AlphaVectorPlanning::Initialize();
    Perseus::Initialize();
}